

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmLocalGenerator::LinearGetSourceFileWithOutput
          (cmLocalGenerator *this,string *name,cmSourceOutputKind kind,bool *byproduct)

{
  bool bVar1;
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  *this_00;
  reference this_01;
  pointer pcVar2;
  cmCustomCommand *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *src;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  *__range1;
  cmSourceFile *fallback;
  bool *byproduct_local;
  cmSourceOutputKind kind_local;
  string *name_local;
  cmLocalGenerator *this_local;
  
  *byproduct = false;
  __range1 = (vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
              *)0x0;
  this_00 = cmMakefile::GetSourceFiles(this->Makefile);
  __end1 = std::
           vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
           ::begin(this_00);
  src = (unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
        std::
        vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
        ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
                                *)&src);
    if (!bVar1) {
      *byproduct = __range1 !=
                   (vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                    *)0x0;
      return (cmSourceFile *)__range1;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
              ::operator*(&__end1);
    pcVar2 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->(this_01);
    pcVar3 = cmSourceFile::GetCustomCommand(pcVar2);
    if (pcVar3 != (cmCustomCommand *)0x0) {
      pcVar2 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->
                         (this_01);
      pcVar3 = cmSourceFile::GetCustomCommand(pcVar2);
      pvVar4 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar3);
      bVar1 = anon_unknown.dwarf_116753d::AnyOutputMatches(name,pvVar4);
      if (bVar1) {
        pcVar2 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get(this_01);
        return pcVar2;
      }
      if (kind == OutputOrByproduct) {
        pcVar2 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->
                           (this_01);
        pcVar3 = cmSourceFile::GetCustomCommand(pcVar2);
        pvVar4 = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar3);
        bVar1 = anon_unknown.dwarf_116753d::AnyOutputMatches(name,pvVar4);
        if (bVar1) {
          __range1 = (vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                      *)std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get
                                  (this_01);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_*,_std::vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

cmSourceFile* cmLocalGenerator::LinearGetSourceFileWithOutput(
  const std::string& name, cmSourceOutputKind kind, bool& byproduct) const
{
  // Outputs take precedence over byproducts.
  byproduct = false;
  cmSourceFile* fallback = nullptr;

  // Look through all the source files that have custom commands and see if the
  // custom command has the passed source file as an output.
  for (const auto& src : this->Makefile->GetSourceFiles()) {
    // Does this source file have a custom command?
    if (src->GetCustomCommand()) {
      // Does the output of the custom command match the source file name?
      if (AnyOutputMatches(name, src->GetCustomCommand()->GetOutputs())) {
        // Return the first matching output.
        return src.get();
      }
      if (kind == cmSourceOutputKind::OutputOrByproduct) {
        if (AnyOutputMatches(name, src->GetCustomCommand()->GetByproducts())) {
          // Do not return the source yet as there might be a matching output.
          fallback = src.get();
        }
      }
    }
  }

  // Did we find a byproduct?
  byproduct = fallback != nullptr;
  return fallback;
}